

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType __thiscall ValueType::SetArrayTypeId(ValueType *this,TypeId typeId)

{
  code *pcVar1;
  bool bVar2;
  Bits bits;
  ObjectType OVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar4;
  undefined4 *puVar5;
  
  bVar2 = IsLikelyArrayOrObjectWithArray(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x330,"(IsLikelyArrayOrObjectWithArray())",
                       "IsLikelyArrayOrObjectWithArray()");
    if (!bVar2) goto LAB_009f23de;
    *puVar5 = 0;
  }
  bVar2 = Js::JavascriptArray::IsNonES5Array(typeId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x331,"(JavascriptArray::IsNonES5Array(typeId))",
                       "JavascriptArray::IsNonES5Array(typeId)");
    if (!bVar2) goto LAB_009f23de;
    *puVar5 = 0;
  }
  if (typeId == TypeIds_Array) {
    bits = (this->field_0).bits | IntIsLikelyUntagged;
  }
  else {
    if (((this->field_0).bits & Object) == 0) {
LAB_009f236d:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x332,
                         "(typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array)"
                         ,
                         "typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array"
                        );
      if (!bVar2) {
LAB_009f23de:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    else {
      OVar3 = GetObjectType(this);
      if (OVar3 != Array) goto LAB_009f236d;
    }
    bits = (this->field_0).bits & ~(IntIsLikelyUntagged|IntCanBeUntagged);
    if (typeId != TypeIds_ArrayLast) goto LAB_009f23cc;
  }
  bits = bits | IntCanBeUntagged;
LAB_009f23cc:
  aVar4.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(bits);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar4.field_0;
}

Assistant:

ValueType ValueType::SetArrayTypeId(const Js::TypeId typeId) const
{
    using namespace Js;
    Assert(IsLikelyArrayOrObjectWithArray());
    Assert(JavascriptArray::IsNonES5Array(typeId));
    Assert(typeId == TypeIds_Array || IsLikelyObject() && GetObjectType() == ObjectType::Array); // objects with native arrays are currently not supported

    Bits newBits = bits & ~(Bits::NonInts | Bits::NonFloats);
    switch(typeId)
    {
        case TypeIds_Array:
            newBits |= Bits::NonFloats;
            // fall through

        case TypeIds_NativeFloatArray:
            newBits |= Bits::NonInts;
            break;
    }
    return Verify(newBits);
}